

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void parsePath(xmllintState *lint,xmlChar *path)

{
  xmlChar *pxVar1;
  bool bVar2;
  xmlChar *local_20;
  xmlChar *cur;
  xmlChar *path_local;
  xmllintState *lint_local;
  
  cur = path;
  if (path != (xmlChar *)0x0) {
    while (*cur != '\0') {
      if (0x3f < lint->nbpaths) {
        fprintf((FILE *)lint->errStream,"MAX_PATHS reached: too many paths\n");
        lint->progresult = XMLLINT_ERR_UNCLASS;
        return;
      }
      local_20 = cur;
      while( true ) {
        pxVar1 = local_20;
        bVar2 = true;
        if (*local_20 != ' ') {
          bVar2 = *local_20 == ':';
        }
        if (!bVar2) break;
        local_20 = local_20 + 1;
      }
      cur = local_20;
      while( true ) {
        bVar2 = false;
        if ((*local_20 != '\0') && (bVar2 = false, *local_20 != ' ')) {
          bVar2 = *local_20 != ':';
        }
        if (!bVar2) break;
        local_20 = local_20 + 1;
      }
      if (local_20 != pxVar1) {
        pxVar1 = (xmlChar *)xmlStrndup(pxVar1,(int)local_20 - (int)pxVar1);
        lint->paths[lint->nbpaths] = pxVar1;
        if (lint->paths[lint->nbpaths] != (xmlChar *)0x0) {
          lint->nbpaths = lint->nbpaths + 1;
        }
        cur = local_20;
      }
    }
  }
  return;
}

Assistant:

static void
parsePath(xmllintState *lint, const xmlChar *path) {
    const xmlChar *cur;

    if (path == NULL)
	return;
    while (*path != 0) {
	if (lint->nbpaths >= MAX_PATHS) {
	    fprintf(lint->errStream, "MAX_PATHS reached: too many paths\n");
            lint->progresult = XMLLINT_ERR_UNCLASS;
	    return;
	}
	cur = path;
	while ((*cur == ' ') || (*cur == PATH_SEPARATOR))
	    cur++;
	path = cur;
	while ((*cur != 0) && (*cur != ' ') && (*cur != PATH_SEPARATOR))
	    cur++;
	if (cur != path) {
	    lint->paths[lint->nbpaths] = xmlStrndup(path, cur - path);
	    if (lint->paths[lint->nbpaths] != NULL)
		lint->nbpaths++;
	    path = cur;
	}
    }
}